

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O2

void pty_select_result(int fd,int event)

{
  void *pvVar1;
  char c [1];
  int fd_local;
  
  fd_local = fd;
  if (pty_signal_pipe[0] == fd) {
    read(fd,c,1);
    pty_try_wait();
  }
  else {
    pvVar1 = find234(ptyfds,&fd_local,ptyfd_find);
    if (pvVar1 != (void *)0x0) {
      pty_real_select_result(*(Pty **)((long)pvVar1 + 8),fd_local,event,0);
    }
  }
  return;
}

Assistant:

void pty_select_result(int fd, int event)
{
    if (fd == pty_signal_pipe[0]) {
        char c[1];

        if (read(pty_signal_pipe[0], c, 1) <= 0)
            /* ignore error */;
        /* ignore its value; it'll be `x' */

        pty_try_wait();
    } else {
        PtyFd *ptyfd = find234(ptyfds, &fd, ptyfd_find);

        if (ptyfd)
            pty_real_select_result(ptyfd->pty, fd, event, 0);
    }
}